

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_manager.cpp
# Opt level: O3

vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_true> * __thiscall
duckdb::MetadataManager::GetBlocks
          (vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_true> *__return_storage_ptr__,
          MetadataManager *this)

{
  __node_base *p_Var1;
  
  (__return_storage_ptr__->
  super_vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
  ).
  super__Vector_base<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
  ).
  super__Vector_base<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
  ).
  super__Vector_base<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->blocks)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    ::std::
    vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
    ::push_back(&__return_storage_ptr__->
                 super_vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
                ,(value_type *)(p_Var1 + 2));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<shared_ptr<BlockHandle>> MetadataManager::GetBlocks() const {
	vector<shared_ptr<BlockHandle>> result;
	for (auto &entry : blocks) {
		result.push_back(entry.second.block);
	}
	return result;
}